

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_replace_plugin(_func_void *oldplugin,_func_void *newplugin)

{
  fsnav_plugin *pfVar1;
  char cVar2;
  long lVar3;
  fsnav_struct *pfVar4;
  ulong uVar5;
  
  lVar3 = 0;
  cVar2 = '\0';
  pfVar4 = fsnav;
  for (uVar5 = 0; uVar5 < (pfVar4->core).plugin_count; uVar5 = uVar5 + 1) {
    pfVar1 = (pfVar4->core).plugins;
    if (*(_func_void **)((long)&pfVar1->func + lVar3) == oldplugin) {
      *(_func_void **)((long)&pfVar1->func + lVar3) = newplugin;
      cVar2 = '\x01';
      pfVar4 = fsnav;
    }
    lVar3 = lVar3 + 0x18;
  }
  return cVar2;
}

Assistant:

char fsnav_replace_plugin(void(*oldplugin)(void), void(*newplugin)(void))
{
	size_t i;
	char flag;

	for (i = 0, flag = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func != oldplugin)
			continue;
		fsnav->core.plugins[i].func = newplugin;
		flag = 1;
	}

	return flag;
}